

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O2

string * __thiscall
multi_agent_planning::PlanningAgent::planToString_abi_cxx11_
          (string *__return_storage_ptr__,PlanningAgent *this,Plan *plan)

{
  ostream *poVar1;
  pointer pPVar2;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"Plan for agent ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->agent_id);
  std::operator<<(poVar1,": ");
  pPVar2 = (plan->actions).
           super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::operator<<(poVar1," ");
  for (; pPVar2 != (plan->actions).
                   super__Vector_base<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::operator<<(poVar1," ");
  }
  poVar1 = std::operator<<(local_1a0,"  (cost: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,plan->cost);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string PlanningAgent::planToString(const Plan& plan) {
	stringstream ss;

	ss << "Plan for agent " << agent_id << ": ";

	//ss << "  states: ";
	
	auto it = plan.actions.begin();
	ss << it->source << " ";
	for (; it != plan.actions.end(); ++it) {
		ss << it->target << " ";
	}

	//ss << endl;

	/*
	it = plan.actions.begin();
	for (; it != plan.actions.end(); ++it) {
		ss << "time " << it->start_time << ": " << it->edge << endl;
	}
	*/
	

	ss << "  (cost: " << plan.cost << ")" << endl;

	//ss << "------------------------" << endl;

	return ss.str();
}